

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

bool bssl::SSL_get_traffic_secrets
               (SSL *ssl,Span<const_unsigned_char> *out_read_traffic_secret,
               Span<const_unsigned_char> *out_write_traffic_secret)

{
  byte bVar1;
  int iVar2;
  int line;
  
  if ((ssl->method->is_dtls == false) && (ssl->quic_method == (SSL_QUIC_METHOD *)0x0)) {
    if ((ssl->s3->field_0xdc & 0x10) == 0) {
      iVar2 = 0x11c;
      line = 0x157;
    }
    else {
      iVar2 = SSL_version((SSL *)ssl);
      if (0x303 < iVar2) {
        bVar1 = (ssl->s3->read_traffic_secret).size_;
        out_read_traffic_secret->data_ = (uchar *)&ssl->s3->read_traffic_secret;
        out_read_traffic_secret->size_ = (ulong)bVar1;
        bVar1 = (ssl->s3->write_traffic_secret).size_;
        out_write_traffic_secret->data_ = (uchar *)&ssl->s3->write_traffic_secret;
        out_write_traffic_secret->size_ = (ulong)bVar1;
        return true;
      }
      iVar2 = 0xf6;
      line = 0x15c;
    }
  }
  else {
    iVar2 = 0x42;
    line = 0x152;
  }
  ERR_put_error(0x10,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return false;
}

Assistant:

int SSL_is_dtls(const SSL *ssl) { return ssl->method->is_dtls; }